

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CS248::Application::set_up_pathtracer(Application *this)

{
  PathTracer *in_RDI;
  PathTracer *unaff_retaddr;
  Scene *in_stack_00000080;
  double in_stack_00000088;
  Scene *in_stack_00000090;
  Camera *in_stack_ffffffffffffffd8;
  PathTracer *in_stack_ffffffffffffffe0;
  pointer in_stack_ffffffffffffffe8;
  PathTracer *scene;
  
  if ((*(int *)((long)&in_RDI->scene + 4) == 0) || (*(int *)((long)&in_RDI->scene + 4) == 2)) {
    scene = in_RDI;
    PathTracer::set_camera(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (*(int *)&in_RDI->camera == 9) {
      in_stack_ffffffffffffffe8 =
           (in_RDI->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      in_stack_ffffffffffffffe0 =
           (PathTracer *)
           (in_RDI->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      Timeline::getCurrentFrame((Timeline *)&in_RDI[2].ns_area_light);
      DynamicScene::Scene::get_transformed_static_scene(in_stack_00000090,in_stack_00000088);
      PathTracer::set_scene(unaff_retaddr,(Scene *)scene);
    }
    else {
      DynamicScene::Scene::get_static_scene(in_stack_00000080);
      PathTracer::set_scene(unaff_retaddr,(Scene *)scene);
    }
    PathTracer::set_frame_size
              (in_RDI,(size_t)in_stack_ffffffffffffffe8,(size_t)in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void Application::set_up_pathtracer() {
  if (mode != MODEL_MODE && mode != ANIMATE_MODE) return;
  pathtracer->set_camera(&camera);
  if (action == Action::Raytrace_Video) {
    pathtracer->set_scene(
        scene->get_transformed_static_scene(timeline.getCurrentFrame()));
  } else {
    pathtracer->set_scene(scene->get_static_scene());
  }
  pathtracer->set_frame_size(screenW, screenH);
}